

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O2

void sinf_norm_error(int nrhs,SuperMatrix *X,float *xtrue)

{
  float fVar1;
  int *piVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  
  piVar2 = (int *)X->Store;
  if (nrhs < 1) {
    nrhs = 0;
  }
  lVar3 = *(long *)(piVar2 + 2);
  for (iVar7 = 0; iVar7 != nrhs; iVar7 = iVar7 + 1) {
    uVar5 = (ulong)(uint)X->nrow;
    if (X->nrow < 1) {
      uVar5 = 0;
    }
    auVar8 = ZEXT816(0);
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      fVar1 = *(float *)((long)(*piVar2 * iVar7) * 4 + lVar3 + uVar6 * 4);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = CONCAT44(fVar1 - xtrue[uVar6],fVar1) & 0x7fffffff7fffffff;
      auVar8 = maxps(auVar8,auVar4);
    }
    printf("||X - Xtrue||/||X|| = %e\n",(double)(auVar8._4_4_ / auVar8._0_4_));
  }
  return;
}

Assistant:

void sinf_norm_error(int nrhs, SuperMatrix *X, float *xtrue)
{
    DNformat *Xstore;
    float err, xnorm;
    float *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}